

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void fmt::v5::internal::grisu2_format
               (double value,char *buffer,size_t *size,char type,int precision,
               bool write_decimal_point)

{
  bool bVar1;
  double extraout_XMM0_Qa;
  int digits_to_remove_1;
  int digits_to_remove;
  int iStack_30;
  bool upper;
  int default_precision;
  int dec_exp;
  bool write_decimal_point_local;
  int precision_local;
  char type_local;
  size_t *size_local;
  char *buffer_local;
  double value_local;
  
  default_precision._3_1_ = write_decimal_point;
  dec_exp = precision;
  write_decimal_point_local = (bool)type;
  _precision_local = size;
  size_local = (size_t *)buffer;
  buffer_local = (char *)value;
  if (value < 0.0) {
    __assert_fail("(value >= 0) && \"value is negative\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/lib/logging/spdlog/fmt/bundled/format-inl.h"
                  ,0x283,
                  "void fmt::internal::grisu2_format(double, char *, size_t &, char, int, bool)");
  }
  iStack_30 = 0;
  if (value <= 0.0) {
    *buffer = '0';
    *size = 1;
  }
  else {
    grisu2_format_positive(value,buffer,size,&stack0xffffffffffffffd0);
    value = extraout_XMM0_Qa;
  }
  if (dec_exp < 0) {
    dec_exp = 6;
  }
  digits_to_remove_1._3_1_ = false;
  if (write_decimal_point_local != false) {
    if (write_decimal_point_local == true) {
LAB_00164893:
      format_exp_notation((char *)size_local,_precision_local,iStack_30,dec_exp,
                          write_decimal_point_local == true);
      return;
    }
    if (write_decimal_point_local == true) {
      digits_to_remove_1._3_1_ = true;
LAB_00164851:
      if (0 < -dec_exp - iStack_30) {
        round(value);
      }
      goto LAB_001648ba;
    }
    if (write_decimal_point_local == true) {
      digits_to_remove_1._3_1_ = true;
    }
    else {
      if (write_decimal_point_local == true) goto LAB_00164893;
      if (write_decimal_point_local == true) goto LAB_00164851;
      if (write_decimal_point_local != true) goto LAB_001648ba;
    }
  }
  if (0 < (int)*_precision_local - dec_exp) {
    round(value);
    while( true ) {
      bVar1 = false;
      if (*_precision_local != 0) {
        bVar1 = *(char *)((long)size_local + (*_precision_local - 1)) == '0';
      }
      if (!bVar1) break;
      *_precision_local = *_precision_local - 1;
      iStack_30 = iStack_30 + 1;
    }
  }
  dec_exp = 0;
LAB_001648ba:
  if (((default_precision._3_1_ & 1) != 0) && (dec_exp < 1)) {
    dec_exp = 1;
  }
  grisu2_prettify((char *)size_local,_precision_local,iStack_30,dec_exp,digits_to_remove_1._3_1_);
  return;
}

Assistant:

FMT_FUNC void grisu2_format(double value, char *buffer, size_t &size, char type,
                            int precision, bool write_decimal_point) {
  FMT_ASSERT(value >= 0, "value is negative");
  int dec_exp = 0;  // K in Grisu.
  if (value > 0) {
    grisu2_format_positive(value, buffer, size, dec_exp);
  } else {
    *buffer = '0';
    size = 1;
  }
  const int default_precision = 6;
  if (precision < 0)
    precision = default_precision;
  bool upper = false;
  switch (type) {
  case 'G':
    upper = true;
    FMT_FALLTHROUGH
  case '\0': case 'g': {
    int digits_to_remove = static_cast<int>(size) - precision;
    if (digits_to_remove > 0) {
      round(buffer, size, dec_exp, digits_to_remove);
      // Remove trailing zeros.
      while (size > 0 && buffer[size - 1] == '0') {
        --size;
        ++dec_exp;
      }
    }
    precision = 0;
    break;
  }
  case 'F':
    upper = true;
    FMT_FALLTHROUGH
  case 'f': {
    int digits_to_remove = -dec_exp - precision;
    if (digits_to_remove > 0) {
      if (digits_to_remove >= static_cast<int>(size))
        digits_to_remove = static_cast<int>(size) - 1;
      round(buffer, size, dec_exp, digits_to_remove);
    }
    break;
  }
  case 'e': case 'E':
    format_exp_notation(buffer, size, dec_exp, precision, type == 'E');
    return;
  }
  if (write_decimal_point && precision < 1)
    precision = 1;
  grisu2_prettify(buffer, size, dec_exp, precision, upper);
}